

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O0

void __thiscall
optimization::global_expr_move::BlockOps::BlockOps(BlockOps *this,BasicBlk *blk,bool offset)

{
  bool bVar1;
  int iVar2;
  pair<const_optimization::global_expr_move::Op,_mir::inst::VarId> *ppVar3;
  pointer pIVar4;
  size_type sVar5;
  byte in_DL;
  long in_RSI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>,_bool>
  pVar6;
  pair<std::_Rb_tree_const_iterator<mir::inst::VarId>,_bool> pVar7;
  StoreOffsetInst *storeInst;
  VarId addr;
  LoadOffsetInst *loadInst;
  OpInst *opInst;
  Inst *i;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range2;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  _Rb_tree_const_iterator<mir::inst::VarId> in_stack_fffffffffffffd60;
  value_type *in_stack_fffffffffffffd68;
  pair<const_optimization::global_expr_move::Op,_mir::inst::VarId> *in_stack_fffffffffffffd70;
  Op in_stack_fffffffffffffd7c;
  _Rb_tree_iterator<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  in_stack_fffffffffffffd80;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_28;
  long local_20;
  byte local_11;
  long local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  std::
  unordered_map<optimization::global_expr_move::Op,_mir::inst::VarId,_optimization::global_expr_move::hasher,_std::equal_to<optimization::global_expr_move::Op>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>_>
  ::unordered_map((unordered_map<optimization::global_expr_move::Op,_mir::inst::VarId,_optimization::global_expr_move::hasher,_std::equal_to<optimization::global_expr_move::Op>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>_>
                   *)0x1828e7);
  std::
  map<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId,_std::less<std::pair<mir::inst::VarId,_mir::inst::Value>_>,_std::allocator<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_>
  ::map((map<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId,_std::less<std::pair<mir::inst::VarId,_mir::inst::Value>_>,_std::allocator<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_>
         *)0x182900);
  std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
            ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x182919);
  local_20 = local_10 + 0x40;
  local_28._M_current =
       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
       std::
       vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
       ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                             *)in_stack_fffffffffffffd60._M_node,
                            (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58)), bVar1
        ) {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
    ::operator*(&local_28);
    ppVar3 = (pair<const_optimization::global_expr_move::Op,_mir::inst::VarId> *)
             std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator*
                       ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                        in_stack_fffffffffffffd60._M_node);
    pIVar4 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                       ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                        0x1829ac);
    iVar2 = (*(pIVar4->super_Displayable)._vptr_Displayable[1])();
    if (iVar2 == 1) {
      if (ppVar3 != (pair<const_optimization::global_expr_move::Op,_mir::inst::VarId> *)0x0) {
        __dynamic_cast(ppVar3,&mir::inst::Inst::typeinfo,&mir::inst::OpInst::typeinfo,0);
      }
      mir::inst::Value::Value
                ((Value *)in_stack_fffffffffffffd60._M_node,
                 (Value *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
      mir::inst::Value::Value
                ((Value *)in_stack_fffffffffffffd60._M_node,
                 (Value *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
      Op::Op((Op *)in_stack_fffffffffffffd80._M_node,in_stack_fffffffffffffd7c,
             (Value *)in_stack_fffffffffffffd70,(Value *)in_stack_fffffffffffffd68);
      std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>::
      pair<optimization::global_expr_move::Op,_mir::inst::VarId_&,_true>
                (in_stack_fffffffffffffd70,&in_stack_fffffffffffffd68->first,
                 (VarId *)in_stack_fffffffffffffd60._M_node);
      std::
      unordered_map<optimization::global_expr_move::Op,_mir::inst::VarId,_optimization::global_expr_move::hasher,_std::equal_to<optimization::global_expr_move::Op>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>_>
      ::insert((unordered_map<optimization::global_expr_move::Op,_mir::inst::VarId,_optimization::global_expr_move::hasher,_std::equal_to<optimization::global_expr_move::Op>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>_>
                *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    }
    else if ((local_11 & 1) != 0) {
      pIVar4 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x182b51);
      iVar2 = (*(pIVar4->super_Displayable)._vptr_Displayable[1])();
      if (iVar2 == 3) {
        if (ppVar3 != (pair<const_optimization::global_expr_move::Op,_mir::inst::VarId> *)0x0) {
          __dynamic_cast(ppVar3,&mir::inst::Inst::typeinfo,&mir::inst::LoadOffsetInst::typeinfo,0);
        }
        std::get<mir::inst::VarId,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x182bcd);
        mir::inst::VarId::VarId
                  ((VarId *)in_stack_fffffffffffffd60._M_node,
                   (VarId *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
        sVar5 = std::
                set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         *)in_stack_fffffffffffffd70,(key_type *)in_stack_fffffffffffffd68);
        if (sVar5 == 0) {
          std::pair<mir::inst::VarId,_mir::inst::Value>::
          pair<mir::inst::VarId_&,_mir::inst::Value_&,_true>
                    ((pair<mir::inst::VarId,_mir::inst::Value> *)in_stack_fffffffffffffd70,
                     (VarId *)in_stack_fffffffffffffd68,(Value *)in_stack_fffffffffffffd60._M_node);
          std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>::
          pair<mir::inst::VarId_&,_true>
                    ((pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> *)
                     in_stack_fffffffffffffd70,
                     (pair<mir::inst::VarId,_mir::inst::Value> *)in_stack_fffffffffffffd68,
                     (VarId *)in_stack_fffffffffffffd60._M_node);
          pVar6 = std::
                  map<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId,_std::less<std::pair<mir::inst::VarId,_mir::inst::Value>_>,_std::allocator<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_>
                  ::insert((map<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId,_std::less<std::pair<mir::inst::VarId,_mir::inst::Value>_>,_std::allocator<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_>
                            *)in_stack_fffffffffffffd70,(value_type *)in_stack_fffffffffffffd68);
          in_stack_fffffffffffffd80 = pVar6.first._M_node;
          in_stack_fffffffffffffd7c = CONCAT13(pVar6.second,(int3)in_stack_fffffffffffffd7c);
        }
      }
      else {
        pIVar4 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x182cb6);
        iVar2 = (*(pIVar4->super_Displayable)._vptr_Displayable[1])();
        if (iVar2 == 4) {
          if (ppVar3 == (pair<const_optimization::global_expr_move::Op,_mir::inst::VarId> *)0x0) {
            in_stack_fffffffffffffd68 = (value_type *)0x0;
          }
          else {
            in_stack_fffffffffffffd68 =
                 (value_type *)
                 __dynamic_cast(ppVar3,&mir::inst::Inst::typeinfo,
                                &mir::inst::StoreOffsetInst::typeinfo,0);
          }
          pVar7 = std::
                  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  ::insert((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                            *)in_stack_fffffffffffffd80._M_node,
                           (value_type *)CONCAT44(in_stack_fffffffffffffd7c,iVar2));
          in_stack_fffffffffffffd60 = pVar7.first._M_node;
          in_stack_fffffffffffffd5f = pVar7.second;
          in_stack_fffffffffffffd70 = ppVar3;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

BlockOps(mir::inst::BasicBlk& blk, bool offset = false) {
    for (auto& inst : blk.inst) {
      auto& i = *inst;
      if (inst->inst_kind() == mir::inst::InstKind::Op) {
        auto opInst = dynamic_cast<mir::inst::OpInst*>(&i);
        ops.insert({Op(opInst->op, opInst->lhs, opInst->rhs), opInst->dest});
      } else if (offset) {
        if (inst->inst_kind() == mir::inst::InstKind::Load) {
          auto loadInst = dynamic_cast<mir::inst::LoadOffsetInst*>(&i);
          auto addr = std::get<mir::inst::VarId>(loadInst->src);
          if (stores.count(addr)) {
            continue;
          }
          loads.insert({{addr, loadInst->offset}, loadInst->dest});
        } else if (inst->inst_kind() == mir::inst::InstKind::Store) {
          auto storeInst = dynamic_cast<mir::inst::StoreOffsetInst*>(&i);
          stores.insert(storeInst->dest);
        }
      }
    }
  }